

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData256 *
cfd::core::CryptoUtil::ComputeFastMerkleRoot
          (ByteData256 *__return_storage_ptr__,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *hashes)

{
  size_type sVar1;
  ByteData256 *in_stack_fffffffffffffbe8;
  ByteData256 *in_stack_fffffffffffffbf0;
  pointer *local_3e8;
  ByteData256 *local_3b0;
  ByteData256 local_398;
  ByteData256 local_380;
  undefined1 local_368 [8];
  ByteData256 temp_hash;
  uint local_348;
  int level;
  uint32_t count;
  undefined1 local_338 [8];
  ByteData256 inner [33];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *hashes_local;
  ByteData256 *result_hash;
  
  inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  ByteData256::ByteData256(__return_storage_ptr__);
  sVar1 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size(hashes)
  ;
  if (sVar1 == 0) {
    inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    local_3b0 = (ByteData256 *)local_338;
    do {
      ByteData256::ByteData256(local_3b0);
      local_3b0 = local_3b0 + 1;
    } while (local_3b0 !=
             (ByteData256 *)
             &inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_348 = 0;
    while (sVar1 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
                   size(hashes), local_348 < sVar1) {
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                (hashes,(ulong)local_348);
      ByteData256::ByteData256(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      local_348 = local_348 + 1;
      temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      while ((local_348 &
             1 << ((byte)temp_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f)) == 0) {
        MerkleHashSha256Midstate
                  (&local_380,
                   (ByteData256 *)
                   &inner[(long)temp_hash.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1].data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_368);
        ByteData256::operator=((ByteData256 *)local_368,&local_380);
        ByteData256::~ByteData256((ByteData256 *)0x3f210a);
        temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
      ByteData256::operator=
                ((ByteData256 *)
                 &inner[(long)temp_hash.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1].data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_368);
      ByteData256::~ByteData256((ByteData256 *)0x3f21e2);
    }
    temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    while ((local_348 &
           1 << ((byte)temp_hash.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f)) == 0) {
      temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    }
    ByteData256::operator=
              (__return_storage_ptr__,
               (ByteData256 *)
               &inner[(long)temp_hash.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1].data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    while (local_348 !=
           1 << ((byte)temp_hash.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f)) {
      local_348 = (1 << ((byte)temp_hash.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f)) +
                  local_348;
      while (temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                  temp_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
            (local_348 &
            1 << ((byte)temp_hash.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f)) == 0) {
        MerkleHashSha256Midstate
                  (&local_398,
                   (ByteData256 *)
                   &inner[(long)temp_hash.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1].data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,__return_storage_ptr__);
        ByteData256::operator=(__return_storage_ptr__,&local_398);
        ByteData256::~ByteData256((ByteData256 *)0x3f22e9);
      }
    }
    inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    local_3e8 = &inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_3e8 = local_3e8 + -3;
      ByteData256::~ByteData256((ByteData256 *)0x3f233c);
    } while (local_3e8 != (pointer *)local_338);
  }
  if ((inner[0x20].data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    ByteData256::~ByteData256((ByteData256 *)0x3f23b8);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 CryptoUtil::ComputeFastMerkleRoot(
    const std::vector<ByteData256> &hashes) {
  static constexpr uint32_t kUintValue1 = 1;
  ByteData256 result_hash;
  if (hashes.size() == 0) return result_hash;

  // inner is an array of eagerly computed subtree hashes, indexed by tree
  // level (0 being the leaves).
  // For example, when count is 25 (11001 in binary), inner[4] is the hash of
  // the first 16 leaves, inner[3] of the next 8 leaves, and inner[0] equal to
  // the last leaf. The other inner entries are undefined.
  //
  // First process all leaves into 'inner' values.
  ByteData256 inner[33];
  uint32_t count = 0;
  int level;
  while (count < hashes.size()) {
    ByteData256 temp_hash = hashes[count];
    ++count;
    // For each of the lower bits in count that are 0, do 1 step. Each
    // corresponds to an inner value that existed before processing the
    // current leaf, and each needs a hash to combine it.
    level = 0;
    while ((count & (kUintValue1 << level)) == 0) {
      temp_hash = MerkleHashSha256Midstate(inner[level], temp_hash);
      ++level;
    }
    // Store the resulting hash at inner position level.
    inner[level] = temp_hash;
  }

  // Do a final 'sweep' over the rightmost branch of the tree to process
  // odd levels, and reduce everything to a single top value.
  // Level is the level (counted from the bottom) up to which we've sweeped.
  //
  // As long as bit number level in count is zero, skip it. It means there
  // is nothing left at this level.
  level = 0;
  while ((count & (kUintValue1 << level)) == 0) {
    ++level;
  }
  result_hash = inner[level];

  while (count != (kUintValue1 << level)) {
    // If we reach this point, hash is an inner value that is not the top.
    // We combine it with itself (Bitcoin's special rule for odd levels in
    // the tree) to produce a higher level one.

    // Increment count to the value it would have if two entries at this
    // level had existed and propagate the result upwards accordingly.
    count += (kUintValue1 << level);
    ++level;
    while ((count & (kUintValue1 << level)) == 0) {
      result_hash = MerkleHashSha256Midstate(inner[level], result_hash);
      ++level;
    }
  }
  return result_hash;
}